

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg.c
# Opt level: O1

void cf_hash_drbg_sha256_gen_additional
               (cf_hash_drbg_sha256 *ctx,void *addnl,size_t naddnl,void *out,size_t nout)

{
  code *pcVar1;
  int oi;
  long lVar2;
  uint uVar3;
  ulong nin;
  code *pcVar4;
  uint8_t *bout;
  ulong __n;
  ulong uVar5;
  bool bVar6;
  uint8_t three;
  uint8_t two;
  uint8_t w [64];
  cf_chash_ctx ctx_1;
  undefined1 local_251;
  void *local_250;
  code *local_248;
  code *local_240;
  code *local_238;
  uint local_22c;
  ulong local_228;
  ulong local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined7 uStack_1f0;
  undefined1 uStack_1e9;
  undefined7 uStack_1e8;
  uint8_t local_1d8 [64];
  undefined1 local_198 [360];
  
  if (nout != 0) {
    local_238 = cf_sha256_init;
    pcVar4 = cf_sha256_update;
    local_240 = cf_sha256_update;
    local_248 = cf_sha256_digest;
    do {
      local_228 = 0x10000;
      if (nout < 0x10000) {
        local_228 = nout;
      }
      if (ctx->reseed_counter == 0) {
        abort();
      }
      local_220 = nout;
      if (naddnl != 0) {
        local_218 = CONCAT71(local_218._1_7_,2);
        local_250 = addnl;
        (*local_238)(local_198);
        pcVar1 = local_240;
        (*local_240)(local_198,&local_218,1);
        (*pcVar1)(local_198,ctx,0x37);
        (*pcVar1)(local_198,local_250,naddnl);
        (*local_248)(local_198,local_1d8);
        add(ctx->V,(size_t)local_1d8,(uint8_t *)0x20,(size_t)pcVar4);
      }
      uStack_1e8 = (undefined7)((ulong)*(undefined8 *)(ctx->V + 0x2f) >> 8);
      local_218 = *(undefined8 *)ctx->V;
      uStack_210 = *(undefined8 *)(ctx->V + 8);
      local_208 = *(undefined8 *)(ctx->V + 0x10);
      uStack_200 = *(undefined8 *)(ctx->V + 0x18);
      local_1f8 = *(undefined8 *)(ctx->V + 0x20);
      uStack_1f0 = (undefined7)*(undefined8 *)(ctx->V + 0x28);
      uStack_1e9 = (undefined1)((ulong)*(undefined8 *)(ctx->V + 0x28) >> 0x38);
      uVar5 = local_228;
      local_250 = out;
      do {
        (*local_238)(local_198);
        (*local_240)(local_198,&local_218,0x37);
        (*local_248)(local_198,local_1d8);
        __n = uVar5;
        if (0x20 < uVar5) {
          __n = 0x20;
        }
        memcpy(out,local_1d8,__n);
        lVar2 = 0x36;
        nin = 0;
        do {
          uVar3 = (int)nin + (uint)(0 < (int)lVar2 + -0x35) +
                  (uint)*(byte *)((long)&local_218 + lVar2);
          *(char *)((long)&local_218 + lVar2) = (char)uVar3;
          nin = (ulong)(uVar3 >> 8);
          bVar6 = lVar2 != 0;
          lVar2 = lVar2 + -1;
        } while (bVar6);
        out = (void *)((long)out + __n);
        uVar5 = uVar5 - __n;
      } while (uVar5 != 0);
      local_251 = 3;
      (*local_238)(local_198);
      pcVar4 = local_240;
      (*local_240)(local_198,&local_251,1);
      (*pcVar4)(local_198,ctx,0x37);
      (*local_248)(local_198,local_1d8);
      uVar3 = ctx->reseed_counter;
      local_22c = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      add(ctx->V,(size_t)local_1d8,(uint8_t *)0x20,nin);
      lVar2 = 0x36;
      uVar3 = 0;
      do {
        uVar3 = (uint)ctx->C[lVar2] + uVar3 + ctx->V[lVar2];
        ctx->V[lVar2] = (uint8_t)uVar3;
        uVar3 = uVar3 >> 8;
        bVar6 = lVar2 != 0;
        lVar2 = lVar2 + -1;
      } while (bVar6);
      lVar2 = 0x36;
      pcVar4 = (code *)0x0;
      do {
        uVar3 = (int)pcVar4 + (uint)ctx->V[lVar2];
        if (0 < (int)lVar2 + -0x32) {
          uVar3 = uVar3 + *(byte *)((long)&local_22c + (lVar2 - 0x33U & 0xffffffff));
        }
        ctx->V[lVar2] = (uint8_t)uVar3;
        pcVar4 = (code *)(ulong)(uVar3 >> 8);
        bVar6 = lVar2 != 0;
        lVar2 = lVar2 + -1;
      } while (bVar6);
      ctx->reseed_counter = ctx->reseed_counter + 1;
      out = (void *)((long)local_250 + local_228);
      addnl = (void *)0x0;
      naddnl = 0;
      nout = local_220 - local_228;
    } while (nout != 0);
  }
  return;
}

Assistant:

void cf_hash_drbg_sha256_gen_additional(cf_hash_drbg_sha256 *ctx,
                                        const void *addnl, size_t naddnl,
                                        void *out, size_t nout)
{
  uint8_t *bout = out;

  /* Generate output in requests of MAX_DRBG_GENERATE in size. */
  while (nout != 0)
  {
    size_t take = MIN(MAX_DRBG_GENERATE, nout);
    hash_gen_request(ctx, addnl, naddnl, bout, take);
    bout += take;
    nout -= take;

    /* Add additional data only once. */
    addnl = NULL;
    naddnl = 0;
  }
}